

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O2

exr_attribute_t * __thiscall Imf_3_4::Context::getAttr(Context *this,int partidx,int attridx)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  undefined4 in_register_00000034;
  exr_attribute_t *attr;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  iVar1 = exr_get_attribute_by_index
                    (*(this->_ctxt).
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     CONCAT44(in_register_00000034,partidx),0,attridx);
  if (iVar1 == 0) {
    return (exr_attribute_t *)0x0;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_190,"Unable to get attribute index ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,attridx);
  poVar2 = std::operator<<(poVar2," for part ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,partidx);
  poVar2 = std::operator<<(poVar2," in file \'");
  pcVar3 = fileName(this);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\'");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

const exr_attribute_t*
Context::getAttr (int partidx, int attridx) const
{
    const exr_attribute_t* attr = nullptr;

    if (EXR_ERR_SUCCESS !=
        exr_get_attribute_by_index (
            *_ctxt, partidx, EXR_ATTR_LIST_FILE_ORDER, attridx, &attr))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get attribute index " << attridx << " for part "
                                             << partidx << " in file '"
                                             << fileName () << "'");
    }

    return attr;
}